

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SerialArena * __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArenaFallback(ThreadSafeArena *this,void *me)

{
  long lVar1;
  SerialArena *pSVar2;
  SerialArena *pSVar3;
  void *in_RCX;
  SerialArena *pSVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  Memory mem;
  Memory MVar6;
  
  for (pSVar2 = *(SerialArena **)(this + 0x10); pSVar2 != (SerialArena *)0x0; pSVar2 = pSVar2->next_
      ) {
    if (pSVar2->owner_ == me) goto LAB_00318eb3;
  }
  MVar6 = AllocateMemory((AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8),0,0x38);
  mem.size = (size_t)me;
  mem.ptr = (void *)MVar6.size;
  pSVar2 = SerialArena::New((SerialArena *)MVar6.ptr,mem,in_RCX);
  pSVar4 = *(SerialArena **)(this + 0x10);
  do {
    pSVar2->next_ = pSVar4;
    LOCK();
    pSVar3 = *(SerialArena **)(this + 0x10);
    bVar5 = pSVar4 == pSVar3;
    if (bVar5) {
      *(SerialArena **)(this + 0x10) = pSVar2;
      pSVar3 = pSVar4;
    }
    UNLOCK();
    pSVar4 = pSVar3;
  } while (!bVar5);
LAB_00318eb3:
  lVar1 = *in_FS_OFFSET;
  *(SerialArena **)(lVar1 + 0x10) = pSVar2;
  *(undefined8 *)(lVar1 + 8) = *(undefined8 *)this;
  *(SerialArena **)(this + 0x18) = pSVar2;
  return pSVar2;
}

Assistant:

PROTOBUF_NOINLINE
SerialArena* ThreadSafeArena::GetSerialArenaFallback(void* me) {
  // Look for this SerialArena in our linked list.
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  for (; serial; serial = serial->next()) {
    if (serial->owner() == me) {
      break;
    }
  }

  if (!serial) {
    // This thread doesn't have any SerialArena, which also means it doesn't
    // have any blocks yet.  So we'll allocate its first block now.
    serial = SerialArena::New(
        AllocateMemory(alloc_policy_.get(), 0, kSerialArenaSize), me);

    SerialArena* head = threads_.load(std::memory_order_relaxed);
    do {
      serial->set_next(head);
    } while (!threads_.compare_exchange_weak(
        head, serial, std::memory_order_release, std::memory_order_relaxed));
  }

  CacheSerialArena(serial);
  return serial;
}